

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall testing::InSequence::InSequence(InSequence *this)

{
  Sequence **ppSVar1;
  ThreadLocal<testing::Sequence_*> *this_00;
  undefined1 *in_RDI;
  Sequence **in_stack_ffffffffffffffc8;
  Sequence *in_stack_ffffffffffffffe0;
  
  ppSVar1 = internal::ThreadLocal<testing::Sequence_*>::get
                      ((ThreadLocal<testing::Sequence_*> *)0x49cdcf);
  if (*ppSVar1 == (Sequence *)0x0) {
    this_00 = (ThreadLocal<testing::Sequence_*> *)operator_new(0x10);
    Sequence::Sequence(in_stack_ffffffffffffffe0);
    internal::ThreadLocal<testing::Sequence_*>::set(this_00,in_stack_ffffffffffffffc8);
    *in_RDI = 1;
  }
  else {
    *in_RDI = 0;
  }
  return;
}

Assistant:

InSequence::InSequence() {
  if (internal::g_gmock_implicit_sequence.get() == NULL) {
    internal::g_gmock_implicit_sequence.set(new Sequence);
    sequence_created_ = true;
  } else {
    sequence_created_ = false;
  }
}